

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

int __thiscall MeCab::anon_unknown_0::ModelImpl::open(ModelImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 extraout_RAX;
  int __oflag_00;
  Param param;
  undefined7 in_stack_fffffffffffffd60;
  byte in_stack_fffffffffffffd67;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  char local_260 [168];
  Param *in_stack_fffffffffffffe48;
  byte local_1;
  
  Param::Param((Param *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  uVar2 = Param::open((Param *)local_260,__file,0x247570);
  if (((uVar2 & 1) == 0) || (bVar1 = load_dictionary_resource(in_stack_fffffffffffffe48), !bVar1)) {
    Param::what((Param *)0x19fa90);
    setGlobalError((char *)0x19faa1);
    local_1 = 0;
  }
  else {
    iVar3 = open(this,local_260,__oflag_00);
    in_stack_fffffffffffffd67 = (byte)iVar3;
    local_1 = in_stack_fffffffffffffd67 & 1;
  }
  Param::~Param((Param *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1);
}

Assistant:

bool ModelImpl::open(const char *arg) {
  Param param;
  if (!param.open(arg, long_options) ||
      !load_dictionary_resource(&param)) {
    setGlobalError(param.what());
    return false;
  }
  return open(param);
}